

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsMacOSMachOLinker.cxx
# Opt level: O1

bool __thiscall
cmBinUtilsMacOSMachOLinker::ResolveDependency
          (cmBinUtilsMacOSMachOLinker *this,string *name,string *executablePath,string *loaderPath,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *rpaths,string *path,bool *resolved)

{
  bool bVar1;
  int iVar2;
  bool bVar3;
  cmBinUtilsMacOSMachOLinker *this_00;
  cmBinUtilsMacOSMachOLinker *this_01;
  string local_50;
  
  *resolved = false;
  this_01 = (cmBinUtilsMacOSMachOLinker *)(name->_M_dataplus)._M_p;
  iVar2 = strncmp((char *)this_01,"@rpath/",7);
  if (iVar2 == 0) {
    ResolveRPathDependency(this,name,executablePath,loaderPath,rpaths,path,resolved);
  }
  else {
    this_00 = this_01;
    iVar2 = strncmp((char *)this_01,"@loader_path/",0xd);
    if (iVar2 == 0) {
      ResolveLoaderPathDependency(this_00,name,loaderPath,path,resolved);
    }
    else {
      iVar2 = strncmp((char *)this_01,"@executable_path/",0x11);
      if (iVar2 == 0) {
        ResolveExecutablePathDependency(this_01,name,executablePath,path,resolved);
      }
      else {
        *resolved = true;
        std::__cxx11::string::_M_assign((string *)path);
      }
    }
  }
  bVar3 = true;
  if (*resolved == true) {
    bVar1 = cmsys::SystemTools::FileIsFullPath(path);
    if (!bVar1) {
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,"Resolved path is not absolute","");
      cmBinUtilsLinker::SetError(&this->super_cmBinUtilsLinker,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool cmBinUtilsMacOSMachOLinker::ResolveDependency(
  std::string const& name, std::string const& executablePath,
  std::string const& loaderPath, std::vector<std::string> const& rpaths,
  std::string& path, bool& resolved)
{
  resolved = false;
  if (cmHasLiteralPrefix(name, "@rpath/")) {
    if (!this->ResolveRPathDependency(name, executablePath, loaderPath, rpaths,
                                      path, resolved)) {
      return false;
    }
  } else if (cmHasLiteralPrefix(name, "@loader_path/")) {
    if (!this->ResolveLoaderPathDependency(name, loaderPath, path, resolved)) {
      return false;
    }
  } else if (cmHasLiteralPrefix(name, "@executable_path/")) {
    if (!this->ResolveExecutablePathDependency(name, executablePath, path,
                                               resolved)) {
      return false;
    }
  } else {
    resolved = true;
    path = name;
  }

  if (resolved && !cmSystemTools::FileIsFullPath(path)) {
    this->SetError("Resolved path is not absolute");
    return false;
  }

  return true;
}